

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::findNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,bool writeDeclaration,
          bool noDefault)

{
  qsizetype *pqVar1;
  long lVar2;
  XmlStringRef *pXVar3;
  Data *data;
  qsizetype lhs;
  bool bVar4;
  NamespaceDeclaration *__ptr;
  char16_t *pcVar5;
  int n;
  ulong uVar6;
  long lVar7;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar8;
  NamespaceDeclaration *pNVar9;
  char16_t *tmp;
  long lVar10;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView s;
  QAnyStringView lhs_00;
  QArrayData *local_c0;
  XmlStringRef *local_a0;
  QString local_88;
  QStringBuilder<char16_t,_QString> local_70;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar9 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  lVar10 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
  if (pNVar9 + lVar10 + 1 != pNVar9) {
    lVar10 = lVar10 * 0x30;
    do {
      lVar7 = *(long *)((long)&(pNVar9->namespaceUri).m_string + lVar10);
      if (lVar7 == 0) {
        aVar8.m_data = (char16_t *)0x0;
      }
      else {
        pcVar5 = *(char16_t **)(lVar7 + 8);
        if (pcVar5 == (char16_t *)0x0) {
          pcVar5 = &QString::_empty;
        }
        aVar8.m_data_utf16 = pcVar5 + *(long *)((long)&(pNVar9->namespaceUri).m_pos + lVar10);
      }
      uVar6 = *(ulong *)((long)&(pNVar9->namespaceUri).m_size + lVar10) | 0x8000000000000000;
      if (lVar7 == 0) {
        uVar6 = 0x8000000000000000;
      }
      lhs_00.m_size = uVar6;
      lhs_00.field_0.m_data = aVar8.m_data;
      bVar4 = QAnyStringView::equal(lhs_00,namespaceUri);
      if ((bVar4) && ((!noDefault || (*(long *)((long)&(pNVar9->prefix).m_size + lVar10) != 0)))) {
        pNVar9 = (NamespaceDeclaration *)((long)&(pNVar9->prefix).m_string + lVar10);
        goto LAB_003985a8;
      }
      lVar10 = lVar10 + -0x30;
    } while (lVar10 != -0x30);
  }
  if (((undefined1  [16])namespaceUri & (undefined1  [16])0x3fffffffffffffff) !=
      (undefined1  [16])0x0) {
    __ptr = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
    lVar7 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
    lVar10 = lVar7 + 1;
    lVar2 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
    if (lVar2 <= lVar10) {
      lVar7 = lVar7 + 2;
      lVar10 = lVar2 * 2;
      if (lVar7 != lVar10 && SBORROW8(lVar7,lVar10) == lVar7 + lVar2 * -2 < 0) {
        lVar10 = lVar7;
      }
      (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar10;
      __ptr = (NamespaceDeclaration *)realloc(__ptr,lVar10 * 0x30);
      (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = __ptr;
      if (__ptr == (NamespaceDeclaration *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qBadAlloc();
        }
        goto LAB_0039868b;
      }
      lVar10 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
    }
    (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar10;
    pNVar9 = __ptr + lVar10;
    pqVar1 = &__ptr[lVar10].namespaceUri.m_pos;
    *pqVar1 = 0;
    pqVar1[1] = 0;
    pqVar1 = &__ptr[lVar10].prefix.m_size;
    *pqVar1 = 0;
    pqVar1[1] = 0;
    __ptr[lVar10].prefix.m_string = (QString *)0x0;
    __ptr[lVar10].prefix.m_pos = 0;
    n = this->namespacePrefixCount + 1;
    this->namespacePrefixCount = n;
    local_a0 = (XmlStringRef *)0x0;
    local_c0 = (QArrayData *)0x0;
    aVar8.m_data = (void *)0x0;
    do {
      QString::number(&local_88,n,10);
      local_70.b.d.size = local_88.d.size;
      local_70.b.d.ptr = local_88.d.ptr;
      local_70.b.d.d = local_88.d.d;
      local_70.a = L'n';
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_50,&local_70);
      lhs = local_50.d.size;
      pcVar5 = local_50.d.ptr;
      data = local_50.d.d;
      local_50.d.d = (Data *)local_c0;
      pXVar3 = (XmlStringRef *)local_50.d.size;
      local_50.d.size = (qsizetype)local_a0;
      local_50.d.ptr = aVar8.m_data_utf16;
      if (local_c0 != (QArrayData *)0x0) {
        LOCK();
        (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c0,2,0x10);
        }
      }
      if (&(local_70.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      n = n + 1;
      lVar10 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
      lVar7 = lVar10 + 1;
      lVar10 = lVar10 * 0x30;
      do {
        lVar7 = lVar7 + -1;
        if (lVar7 < 1) {
          s.m_size = lhs | 0x8000000000000000;
          s.field_0.m_data = pcVar5;
          QXmlStreamPrivateTagStack::addToStringStorage
                    ((XmlStringRef *)&local_70,&this->super_QXmlStreamPrivateTagStack,s);
          (pNVar9->prefix).m_size = (qsizetype)local_70.b.d.ptr;
          (pNVar9->prefix).m_string = (QString *)CONCAT62(local_70._2_6_,local_70.a);
          (pNVar9->prefix).m_pos = (qsizetype)local_70.b.d.d;
          if (&data->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&data->super_QArrayData,2,0x10);
            }
          }
          QXmlStreamPrivateTagStack::addToStringStorage
                    ((XmlStringRef *)&local_70,&this->super_QXmlStreamPrivateTagStack,namespaceUri);
          (pNVar9->namespaceUri).m_size = (qsizetype)local_70.b.d.ptr;
          (pNVar9->namespaceUri).m_string = (QString *)CONCAT62(local_70._2_6_,local_70.a);
          (pNVar9->namespaceUri).m_pos = (qsizetype)local_70.b.d.d;
          if (writeDeclaration) {
            writeNamespaceDeclaration(this,pNVar9);
          }
          goto LAB_003985a8;
        }
        rhs.m_data = (storage_type_conflict *)local_a0;
        rhs.m_size = (qsizetype)pcVar5;
        bVar4 = QtPrivate::operator!=
                          ((QtPrivate *)
                           ((long)&(this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.
                                   data[-1].prefix.m_string + lVar10),(XmlStringRef *)lhs,rhs);
        lVar10 = lVar10 + -0x30;
      } while (bVar4);
      local_c0 = &data->super_QArrayData;
      aVar8.m_data_utf16 = pcVar5;
      local_a0 = pXVar3;
    } while( true );
  }
  pNVar9 = &this->emptyNamespace;
LAB_003985a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pNVar9;
  }
LAB_0039868b:
  __stack_chk_fail();
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &QXmlStreamWriterPrivate::findNamespace(QAnyStringView namespaceUri, bool writeDeclaration, bool noDefault)
{
    for (NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
        if (namespaceDeclaration.namespaceUri == namespaceUri) {
            if (!noDefault || !namespaceDeclaration.prefix.isEmpty())
                return namespaceDeclaration;
        }
    }
    if (namespaceUri.isEmpty())
        return emptyNamespace;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    if (namespaceUri.isEmpty()) {
        namespaceDeclaration.prefix.clear();
    } else {
        QString s;
        int n = ++namespacePrefixCount;
        forever {
            s = u'n' + QString::number(n++);
            qsizetype j = namespaceDeclarations.size() - 2;
            while (j >= 0 && namespaceDeclarations.at(j).prefix != s)
                --j;
            if (j < 0)
                break;
        }
        namespaceDeclaration.prefix = addToStringStorage(s);
    }